

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
AnalyzeShortFunctionDefinition
          (ExpressionContext *ctx,SynShortFunctionDefinition *syntax,FunctionData *genericProto,
          TypeFunction *argumentType)

{
  TypeHandle *pTVar1;
  SynIdentifier *pSVar2;
  ArrayView<ArgumentData> argData_00;
  IntrusiveList<MatchData> argCasts_00;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  SynIdentifier *pSVar7;
  MatchData *this;
  TypeFunction *instanceType_00;
  ExprFunctionDefinition *pEVar8;
  VariableData *pVVar9;
  ExprVariableDefinition *pEVar10;
  ArrayView<ArgumentData> arguments;
  ExprFunctionDefinition *node;
  uint uStack_7a0;
  undefined4 uStack_79c;
  MatchData *local_798;
  MatchData *pMStack_790;
  ExpressionContext *local_780;
  ExprBase *definition;
  undefined4 local_770;
  TypeFunction *local_768;
  TypeFunction *instanceType;
  InplaceStr local_730;
  ArgumentData local_720;
  InplaceStr local_6f0;
  ArgumentData local_6e0;
  TypeBase *local_6b0;
  TypeBase *match;
  IntrusiveList<MatchData> aliases;
  char *name;
  uint length;
  TypeBase *local_678;
  TypeBase *type;
  SynShortFunctionArgument *param;
  TypeHandle *expected;
  SmallArray<ArgumentData,_32U> argData;
  IntrusiveList<MatchData> argCasts;
  TypeBase *returnType;
  TypeFunction *argumentType_local;
  FunctionData *genericProto_local;
  SynShortFunctionDefinition *syntax_local;
  ExpressionContext *ctx_local;
  
  uVar4 = IntrusiveList<SynShortFunctionArgument>::size(&syntax->arguments);
  uVar5 = IntrusiveList<TypeHandle>::size(&argumentType->arguments);
  if (uVar4 == uVar5) {
    argCasts.tail = (MatchData *)argumentType->returnType;
    if ((((TypeBase *)argCasts.tail)->isGeneric & 1U) != 0) {
      argCasts.tail = (MatchData *)ctx->typeAuto;
    }
    IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&argData.allocator);
    SmallArray<ArgumentData,_32U>::SmallArray
              ((SmallArray<ArgumentData,_32U> *)&expected,ctx->allocator);
    param = (SynShortFunctionArgument *)(argumentType->arguments).head;
    for (type = (TypeBase *)(syntax->arguments).head; type != (TypeBase *)0x0;
        type = (TypeBase *)getType<SynShortFunctionArgument>((SynBase *)type->size)) {
      local_678 = (TypeBase *)0x0;
      if (type->refType != (TypeRef *)0x0) {
        local_678 = AnalyzeType(ctx,(SynBase *)type->refType,true,(bool *)0x0);
      }
      if (local_678 == (TypeBase *)0x0) {
        ArgumentData::ArgumentData
                  ((ArgumentData *)&instanceType,(SynBase *)type,false,
                   (SynIdentifier *)(type->arrayTypes).head,
                   (TypeBase *)(param->super_SynBase)._vptr_SynBase,(ExprBase *)0x0);
        SmallArray<ArgumentData,_32U>::push_back
                  ((SmallArray<ArgumentData,_32U> *)&expected,(ArgumentData *)&instanceType);
      }
      else {
        if (local_678 == ctx->typeAuto) {
          anon_unknown.dwarf_6f1cc::Stop
                    (ctx,&syntax->super_SynBase,"ERROR: function argument cannot be an auto type");
        }
        if (local_678 == ctx->typeVoid) {
          anon_unknown.dwarf_6f1cc::Stop
                    (ctx,&syntax->super_SynBase,"ERROR: function argument cannot be a void type");
        }
        bVar3 = isType<TypeError>(local_678);
        if (bVar3) {
          ctx_local = (ExpressionContext *)0x0;
          goto LAB_001a2c68;
        }
        uVar4 = InplaceStr::length((InplaceStr *)&(type->arrayTypes).head[2].listed);
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar4 + 2));
        aliases.tail = (MatchData *)CONCAT44(extraout_var,iVar6);
        pTVar1 = (type->arrayTypes).head;
        NULLC::SafeSprintf((char *)aliases.tail,(ulong)(uVar4 + 2),"%.*s$",
                           (ulong)(uint)(*(int *)&pTVar1[3].type -
                                        (int)*(undefined8 *)&pTVar1[2].listed));
        if ((*(byte *)((long)(param->super_SynBase)._vptr_SynBase + 0x3c) & 1) == 0) {
          pSVar7 = ExpressionContext::get<SynIdentifier>(ctx);
          pSVar2 = (SynIdentifier *)(type->arrayTypes).head;
          InplaceStr::InplaceStr(&local_730,(char *)aliases.tail);
          SynIdentifier::SynIdentifier(pSVar7,pSVar2,local_730);
          ArgumentData::ArgumentData
                    (&local_720,(SynBase *)type,false,pSVar7,
                     (TypeBase *)(param->super_SynBase)._vptr_SynBase,(ExprBase *)0x0);
          SmallArray<ArgumentData,_32U>::push_back
                    ((SmallArray<ArgumentData,_32U> *)&expected,&local_720);
        }
        else {
          IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&match);
          local_6b0 = MatchGenericType(ctx,&syntax->super_SynBase,
                                       (TypeBase *)(param->super_SynBase)._vptr_SynBase,local_678,
                                       (IntrusiveList<MatchData> *)&match,false);
          if (local_6b0 == (TypeBase *)0x0) {
            ctx_local = (ExpressionContext *)0x0;
            goto LAB_001a2c68;
          }
          pSVar7 = ExpressionContext::get<SynIdentifier>(ctx);
          pSVar2 = (SynIdentifier *)(type->arrayTypes).head;
          InplaceStr::InplaceStr(&local_6f0,(char *)aliases.tail);
          SynIdentifier::SynIdentifier(pSVar7,pSVar2,local_6f0);
          ArgumentData::ArgumentData
                    (&local_6e0,(SynBase *)type,false,pSVar7,local_6b0,(ExprBase *)0x0);
          SmallArray<ArgumentData,_32U>::push_back
                    ((SmallArray<ArgumentData,_32U> *)&expected,&local_6e0);
        }
        this = ExpressionContext::get<MatchData>(ctx);
        MatchData::MatchData(this,(SynIdentifier *)(type->arrayTypes).head,local_678);
        IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)&argData.allocator,this);
      }
      param = *(SynShortFunctionArgument **)&(param->super_SynBase).typeID;
    }
    ArrayView<ArgumentData>::ArrayView<32u>
              ((ArrayView<ArgumentData> *)&definition,(SmallArray<ArgumentData,_32U> *)&expected);
    arguments._12_4_ = 0;
    arguments.data = (ArgumentData *)definition;
    arguments.count = local_770;
    instanceType_00 =
         ExpressionContext::GetFunctionType
                   (ctx,&syntax->super_SynBase,(TypeBase *)argCasts.tail,arguments);
    local_798 = (MatchData *)argData.allocator;
    pMStack_790 = argCasts.head;
    local_768 = instanceType_00;
    ArrayView<ArgumentData>::ArrayView<32u>
              ((ArrayView<ArgumentData> *)&node,(SmallArray<ArgumentData,_32U> *)&expected);
    argCasts_00.tail = pMStack_790;
    argCasts_00.head = local_798;
    argData_00.count = uStack_7a0;
    argData_00._12_4_ = uStack_79c;
    argData_00.data = (ArgumentData *)node;
    local_780 = (ExpressionContext *)
                AnalyzeShortFunctionDefinition
                          (ctx,syntax,genericProto,instanceType_00,argCasts_00,argData_00);
    pEVar8 = getType<ExprFunctionDefinition>((ExprBase *)local_780);
    if (pEVar8 != (ExprFunctionDefinition *)0x0) {
      pVVar9 = CreateFunctionContextVariable
                         (ctx,&syntax->super_SynBase,pEVar8->function,(FunctionData *)0x0);
      pEVar8->contextVariable = pVVar9;
      pEVar10 = CreateFunctionContextVariableDefinition
                          (ctx,&syntax->super_SynBase,pEVar8->function,(FunctionData *)0x0,
                           pEVar8->contextVariable);
      pEVar8->contextVariableDefinition = pEVar10;
    }
    ctx_local = local_780;
LAB_001a2c68:
    SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&expected);
  }
  else {
    ctx_local = (ExpressionContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax, FunctionData *genericProto, TypeFunction *argumentType)
{
	if(syntax->arguments.size() != argumentType->arguments.size())
		return NULL;

	TypeBase *returnType = argumentType->returnType;

	if(returnType->isGeneric)
		returnType = ctx.typeAuto;

	IntrusiveList<MatchData> argCasts;
	SmallArray<ArgumentData, 32> argData(ctx.allocator);

	TypeHandle *expected = argumentType->arguments.head;

	for(SynShortFunctionArgument *param = syntax->arguments.head; param; param = getType<SynShortFunctionArgument>(param->next))
	{
		TypeBase *type = NULL;

		if(param->type)
			type = AnalyzeType(ctx, param->type);

		if(type)
		{
			if(type == ctx.typeAuto)
				Stop(ctx, syntax, "ERROR: function argument cannot be an auto type");

			if(type == ctx.typeVoid)
				Stop(ctx, syntax, "ERROR: function argument cannot be a void type");

			if(isType<TypeError>(type))
				return NULL;

			unsigned length = param->name->name.length() + 2;
			char *name = (char*)ctx.allocator->alloc(length);

			NULLC::SafeSprintf(name, length, "%.*s$", FMT_ISTR(param->name->name));

			if(expected->type->isGeneric)
			{
				IntrusiveList<MatchData> aliases;

				if(TypeBase *match = MatchGenericType(ctx, syntax, expected->type, type, aliases, false))
					argData.push_back(ArgumentData(param, false, new (ctx.get<SynIdentifier>()) SynIdentifier(param->name, InplaceStr(name)), match, NULL));
				else
					return NULL;
			}
			else
			{
				argData.push_back(ArgumentData(param, false, new (ctx.get<SynIdentifier>()) SynIdentifier(param->name, InplaceStr(name)), expected->type, NULL));
			}

			argCasts.push_back(new (ctx.get<MatchData>()) MatchData(param->name, type));
		}
		else
		{
			argData.push_back(ArgumentData(param, false, param->name, expected->type, NULL));
		}

		expected = expected->next;
	}

	TypeFunction *instanceType = ctx.GetFunctionType(syntax, returnType, argData);

	ExprBase *definition = AnalyzeShortFunctionDefinition(ctx, syntax, genericProto, instanceType, argCasts, argData);

	if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(definition))
	{
		node->contextVariable = CreateFunctionContextVariable(ctx, syntax, node->function, NULL);
		node->contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, syntax, node->function, NULL, node->contextVariable);
	}

	return definition;
}